

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

void __thiscall BinHash<DnsHashEntry>::Clear(BinHash<DnsHashEntry> *this)

{
  DnsHashEntry *this_00;
  DnsHashEntry *x;
  uint32_t i;
  BinHash<DnsHashEntry> *this_local;
  
  if (this->hashBin != (DnsHashEntry **)0x0) {
    for (x._4_4_ = 0; x._4_4_ < this->tableSize; x._4_4_ = x._4_4_ + 1) {
      while (this->hashBin[x._4_4_] != (DnsHashEntry *)0x0) {
        this_00 = this->hashBin[x._4_4_];
        this->hashBin[x._4_4_] = this_00->HashNext;
        if (this_00 != (DnsHashEntry *)0x0) {
          DnsHashEntry::~DnsHashEntry(this_00);
          operator_delete(this_00);
        }
      }
    }
    if (this->hashBin != (DnsHashEntry **)0x0) {
      operator_delete__(this->hashBin);
    }
    this->hashBin = (DnsHashEntry **)0x0;
  }
  this->tableCount = 0;
  this->tableSize = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }